

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O3

void start_server(uv_loop_t *loop,uv_tcp_t *handle)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  uv_loop_t *puVar4;
  undefined8 *extraout_RDX;
  uv_tcp_t *handle_00;
  uv_tcp_t *puVar5;
  sockaddr_in addr;
  undefined1 auStack_30 [16];
  uv_loop_t *puStack_20;
  undefined1 auStack_18 [16];
  
  puVar5 = (uv_tcp_t *)0x194b4a;
  puStack_20 = (uv_loop_t *)0x1719d3;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_18);
  if (iVar1 == 0) {
    puStack_20 = (uv_loop_t *)0x1719e6;
    puVar5 = (uv_tcp_t *)loop;
    iVar1 = uv_tcp_init(loop,&tcp_server);
    if (iVar1 != 0) goto LAB_00171a26;
    puVar5 = &tcp_server;
    puStack_20 = (uv_loop_t *)0x1719fb;
    iVar1 = uv_tcp_bind(&tcp_server,auStack_18,0);
    if (iVar1 != 0) goto LAB_00171a2b;
    puVar5 = &tcp_server;
    puStack_20 = (uv_loop_t *)0x171a17;
    iVar1 = uv_listen(&tcp_server,0x80,connection_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    puStack_20 = (uv_loop_t *)0x171a26;
    start_server_cold_1();
LAB_00171a26:
    puStack_20 = (uv_loop_t *)0x171a2b;
    start_server_cold_2();
LAB_00171a2b:
    puStack_20 = (uv_loop_t *)0x171a30;
    start_server_cold_3();
  }
  puStack_20 = (uv_loop_t *)do_connect;
  start_server_cold_4();
  handle_00 = (uv_tcp_t *)0x23a3;
  puStack_20 = loop;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_30);
  if (iVar1 == 0) {
    handle_00 = &tcp_client;
    iVar1 = uv_tcp_init(puVar5);
    if (iVar1 != 0) goto LAB_00171a94;
    handle_00 = &tcp_client;
    iVar1 = uv_tcp_connect(&connect_req,&tcp_client,auStack_30,connect_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    do_connect_cold_1();
LAB_00171a94:
    do_connect_cold_2();
  }
  do_connect_cold_3();
  ::loop = (uv_loop_t *)uv_default_loop();
  start_server(::loop,handle_00);
  client_close = 1;
  shutdown_before_close = 1;
  do_connect(::loop,handle_00);
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_00171b52;
    if (shutdown_cb_called != 0) goto LAB_00171b57;
    handle_00 = (uv_tcp_t *)0x0;
    iVar1 = uv_run(::loop);
    if (iVar1 != 0) goto LAB_00171b5c;
    if (write_cb_called != 4) goto LAB_00171b61;
    if (close_cb_called != 0) goto LAB_00171b66;
    if (shutdown_cb_called != 1) goto LAB_00171b6b;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    handle_00 = (uv_tcp_t *)0x0;
    uv_run(uVar3);
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    run_test_tcp_close_reset_client_after_shutdown_cold_1();
LAB_00171b52:
    run_test_tcp_close_reset_client_after_shutdown_cold_2();
LAB_00171b57:
    run_test_tcp_close_reset_client_after_shutdown_cold_3();
LAB_00171b5c:
    run_test_tcp_close_reset_client_after_shutdown_cold_4();
LAB_00171b61:
    run_test_tcp_close_reset_client_after_shutdown_cold_5();
LAB_00171b66:
    run_test_tcp_close_reset_client_after_shutdown_cold_6();
LAB_00171b6b:
    run_test_tcp_close_reset_client_after_shutdown_cold_7();
  }
  run_test_tcp_close_reset_client_after_shutdown_cold_8();
  ::loop = (uv_loop_t *)uv_default_loop();
  start_server(::loop,handle_00);
  client_close = 0;
  shutdown_before_close = 0;
  do_connect(::loop,handle_00);
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_00171c29;
    if (shutdown_cb_called != 0) goto LAB_00171c2e;
    handle_00 = (uv_tcp_t *)0x0;
    iVar1 = uv_run(::loop);
    if (iVar1 != 0) goto LAB_00171c33;
    if (write_cb_called != 4) goto LAB_00171c38;
    if (close_cb_called != 1) goto LAB_00171c3d;
    if (shutdown_cb_called != 0) goto LAB_00171c42;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    handle_00 = (uv_tcp_t *)0x0;
    uv_run(uVar3);
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_cold_1();
LAB_00171c29:
    run_test_tcp_close_reset_accepted_cold_2();
LAB_00171c2e:
    run_test_tcp_close_reset_accepted_cold_3();
LAB_00171c33:
    run_test_tcp_close_reset_accepted_cold_4();
LAB_00171c38:
    run_test_tcp_close_reset_accepted_cold_5();
LAB_00171c3d:
    run_test_tcp_close_reset_accepted_cold_6();
LAB_00171c42:
    run_test_tcp_close_reset_accepted_cold_7();
  }
  run_test_tcp_close_reset_accepted_cold_8();
  ::loop = (uv_loop_t *)uv_default_loop();
  start_server(::loop,handle_00);
  client_close = 0;
  shutdown_before_close = 1;
  puVar4 = ::loop;
  do_connect(::loop,handle_00);
  iVar1 = (int)handle_00;
  if (write_cb_called == 0) {
    if (close_cb_called != 0) goto LAB_00171d00;
    if (shutdown_cb_called != 0) goto LAB_00171d05;
    iVar1 = 0;
    puVar4 = ::loop;
    iVar2 = uv_run(::loop);
    if (iVar2 != 0) goto LAB_00171d0a;
    if (write_cb_called != 4) goto LAB_00171d0f;
    if (close_cb_called != 0) goto LAB_00171d14;
    if (shutdown_cb_called != 1) goto LAB_00171d19;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    iVar1 = 0;
    uv_run(uVar3);
    puVar4 = (uv_loop_t *)uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_after_shutdown_cold_1();
LAB_00171d00:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_2();
LAB_00171d05:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_3();
LAB_00171d0a:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_4();
LAB_00171d0f:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_5();
LAB_00171d14:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_6();
LAB_00171d19:
    run_test_tcp_close_reset_accepted_after_shutdown_cold_7();
  }
  run_test_tcp_close_reset_accepted_after_shutdown_cold_8();
  if (iVar1 == 0) {
    iVar1 = uv_tcp_init(::loop,&tcp_accepted);
    if (iVar1 == 0) {
      iVar1 = uv_accept(puVar4,&tcp_accepted);
      if (iVar1 == 0) {
        uv_read_start(&tcp_accepted,alloc_cb,read_cb);
        return;
      }
      goto LAB_00171d7a;
    }
  }
  else {
    connection_cb_cold_1();
  }
  connection_cb_cold_2();
LAB_00171d7a:
  connection_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return;
}

Assistant:

static void start_server(uv_loop_t* loop, uv_tcp_t* handle) {
  struct sockaddr_in addr;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init(loop, handle);
  ASSERT(r == 0);

  r = uv_tcp_bind(handle, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_listen((uv_stream_t*)handle, 128, connection_cb);
  ASSERT(r == 0);
}